

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

void __thiscall FIX::ExeceptionStore::reset(ExeceptionStore *this,UtcTimeStamp *param_1)

{
  IOException *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"reset IOException",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(IOException) { throw IOException("reset IOException"); }